

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_list.c
# Opt level: O3

char * apprun_string_list_join(char **string_list,char *split)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (string_list != (char **)0x0) {
    uVar7 = 0xffffffffffffffff;
    do {
      lVar1 = uVar7 + 1;
      uVar7 = uVar7 + 1;
    } while (string_list[lVar1] != (char *)0x0);
    sVar2 = strlen(split);
    if (uVar7 != 0) {
      uVar6 = 0;
      uVar5 = 0;
      do {
        sVar3 = strlen(string_list[uVar6]);
        uVar5 = uVar5 + (int)sVar2 + (int)sVar3;
        uVar6 = uVar6 + 1;
      } while ((uVar7 & 0xffffffff) != uVar6);
      uVar6 = 1;
      pcVar4 = (char *)calloc((ulong)uVar5,1);
      if (uVar7 != 0) {
        do {
          strcat(pcVar4,string_list[uVar6 - 1]);
          if (uVar6 < (uVar7 & 0xffffffff)) {
            strcat(pcVar4,split);
          }
          lVar1 = uVar6 + 1;
          uVar6 = uVar6 + 1;
        } while (lVar1 - (uVar7 & 0xffffffff) != 1);
      }
      return pcVar4;
    }
  }
  pcVar4 = (char *)calloc(0,1);
  return pcVar4;
}

Assistant:

char *apprun_string_list_join(char *const *string_list, char *split) {
    unsigned string_list_len = apprun_string_list_len(string_list);
    unsigned split_len = strlen(split);
    unsigned str_size = 0;

    for (int i = 0; i < string_list_len; i++)
        str_size += strlen(string_list[i]) + split_len;

    char *str = calloc(str_size, sizeof(char));
    for (int i = 0; i < string_list_len; i++) {
        strcat(str, string_list[i]);
        if (i + 1 < string_list_len)
            strcat(str, split);
    }

    return str;
}